

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_types.c
# Opt level: O2

void * lyplg_type_print_simple
                 (ly_ctx *UNUSED_ctx,lyd_value *value,LY_VALUE_FORMAT UNUSED_format,
                 void *UNUSED_prefix_data,ly_bool *dynamic,size_t *value_len)

{
  char *__s;
  size_t sVar1;
  
  if (dynamic != (ly_bool *)0x0) {
    *dynamic = '\0';
  }
  __s = value->_canonical;
  if (value_len != (size_t *)0x0) {
    if (__s == (char *)0x0) {
      sVar1 = 0;
    }
    else {
      sVar1 = strlen(__s);
    }
    *value_len = sVar1;
  }
  return __s;
}

Assistant:

LIBYANG_API_DEF const void *
lyplg_type_print_simple(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *value, LY_VALUE_FORMAT UNUSED(format),
        void *UNUSED(prefix_data), ly_bool *dynamic, size_t *value_len)
{
    if (dynamic) {
        *dynamic = 0;
    }
    if (value_len) {
        *value_len = ly_strlen(value->_canonical);
    }
    return value->_canonical;
}